

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void print_xml_help_option_element(ctmbstr element,ctmbstr name)

{
  byte bVar1;
  ulong in_RAX;
  byte *pbVar2;
  char *__s;
  size_t sVar3;
  int iVar4;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (name == (ctmbstr)0x0) {
    return;
  }
  iVar5 = 0;
  pbVar2 = (byte *)name;
LAB_0011bd52:
  bVar1 = *pbVar2;
  if (bVar1 < 0x3c) {
    if (bVar1 != 0x22) {
      if (bVar1 != 0) goto LAB_0011bd7b;
      __s = (char *)malloc((ulong)(iVar5 + 1));
      if (__s == (char *)0x0) {
        outOfMemory();
      }
      *__s = '\0';
      in_RAX = in_RAX & 0xffffffffffffff;
      do {
        bVar1 = *name;
        if (bVar1 < 0x3c) {
          if (bVar1 == 0x22) {
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&quot;",7);
          }
          else {
            if (bVar1 == 0) {
              printf("  <%s>%s</%s>\n",element,__s,element,in_R8,in_R9,in_RAX);
              free(__s);
              return;
            }
LAB_0011be0c:
            in_RAX = CONCAT17((char)(in_RAX >> 0x38),CONCAT16(bVar1,(int6)in_RAX));
            strcat(__s,&stack0xffffffffffffffde);
          }
        }
        else {
          if (bVar1 == 0x3e) {
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&gt;",4);
          }
          else {
            if (bVar1 != 0x3c) goto LAB_0011be0c;
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&lt;",4);
          }
          __s[sVar3 + 4] = '\0';
        }
        name = (ctmbstr)((byte *)name + 1);
      } while( true );
    }
    iVar4 = 6;
  }
  else {
    iVar4 = 4;
    if ((bVar1 != 0x3c) && (bVar1 != 0x3e)) {
LAB_0011bd7b:
      iVar4 = 1;
    }
  }
  iVar5 = iVar5 + iVar4;
  pbVar2 = pbVar2 + 1;
  goto LAB_0011bd52;
}

Assistant:

static void print_xml_help_option_element( ctmbstr element, ctmbstr name )
{
    tmbstr escpName;
    if (!name)
        return;
    printf("  <%s>%s</%s>\n", element, escpName = get_escaped_name(name),
           element);
    free(escpName);
}